

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O1

bool __thiscall option::Parser::StoreOptionAction::perform(StoreOptionAction *this,Option *option)

{
  int iVar1;
  Descriptor *ctx;
  Option *this_00;
  bool bVar2;
  long lVar3;
  Option *pOVar4;
  Option *pOVar5;
  Option *pOVar6;
  
  if ((this->bufmax < 0) || (bVar2 = true, this->parser->op_count < this->bufmax)) {
    lVar3 = (long)this->parser->op_count;
    if (lVar3 == 0x7fffffff) {
      bVar2 = false;
    }
    else {
      Option::init(this->buffer + lVar3,(EVP_PKEY_CTX *)option->desc);
      pOVar6 = this->options;
      iVar1 = this->parser->op_count;
      pOVar4 = this->buffer + iVar1;
      ctx = this->buffer[iVar1].desc;
      this_00 = pOVar6 + (int)ctx->index;
      if ((pOVar6 == (Option *)0x0) ||
         (pOVar5 = this_00, pOVar6[(int)ctx->index].desc == (Descriptor *)0x0)) {
        Option::init(this_00,(EVP_PKEY_CTX *)ctx);
      }
      else {
        do {
          pOVar5 = pOVar5->prev_;
        } while (((ulong)pOVar5 & 1) == 0);
        do {
          pOVar6 = this_00;
          this_00 = pOVar6->prev_;
        } while (((ulong)pOVar6->prev_ & 1) == 0);
        if (ctx == (Descriptor *)0x0) {
          pOVar4 = (Option *)0x0;
        }
        ((Option *)((ulong)pOVar5 & 0xfffffffffffffffe))->next_ = pOVar4;
        pOVar4->prev_ = (Option *)((ulong)pOVar5 & 0xfffffffffffffffe);
        pOVar4->next_ = (Option *)((ulong)pOVar6 | 1);
        pOVar6->prev_ = (Option *)((ulong)pOVar4 | 1);
      }
      this->parser->op_count = this->parser->op_count + 1;
      bVar2 = true;
    }
  }
  return bVar2;
}

Assistant:

bool perform(Option& option)
  {
    if (bufmax < 0 || parser.op_count < bufmax)
    {
      if (parser.op_count == 0x7fffffff)
        return false; // overflow protection: don't accept number of options that doesn't fit signed int

      buffer[parser.op_count] = option;
      int idx = buffer[parser.op_count].desc->index;
      if (options[idx])
        options[idx].append(buffer[parser.op_count]);
      else
        options[idx] = buffer[parser.op_count];
      ++parser.op_count;
    }
    return true; // NOTE: an option that is discarded because of a full buffer is not fatal
  }